

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan_mock.cpp
# Opt level: O3

VkResult shim_vkGetSwapchainImagesKHR
                   (VkDevice device,VkSwapchainKHR swapchain,uint32_t *pSwapchainImageCount,
                   VkImage *pSwapchainImages)

{
  VkResult VVar1;
  initializer_list<VkImage_T_*> __l;
  vector<VkImage_T_*,_std::allocator<VkImage_T_*>_> images;
  allocator_type local_49;
  vector<VkImage_T_*,_std::allocator<VkImage_T_*>_> local_48;
  VkImage_T *local_30;
  undefined8 local_28;
  undefined8 local_20;
  
  local_30 = (VkImage_T *)0xedd0;
  local_28 = 0xedd1;
  local_20 = 0xedd1;
  __l._M_len = 3;
  __l._M_array = &local_30;
  std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>::vector(&local_48,__l,&local_49);
  VVar1 = fill_out_count_pointer_pair<VkImage_T*>(&local_48,pSwapchainImageCount,pSwapchainImages);
  if (local_48.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return VVar1;
}

Assistant:

VKAPI_ATTR VkResult VKAPI_CALL shim_vkGetSwapchainImagesKHR(
    [[maybe_unused]] VkDevice device, [[maybe_unused]] VkSwapchainKHR swapchain, uint32_t* pSwapchainImageCount, VkImage* pSwapchainImages) {

    std::vector<VkImage> images{ get_uint64_handle<VkImage>(0x0000EDD0U),
        get_uint64_handle<VkImage>(0x0000EDD1U),
        get_uint64_handle<VkImage>(0x0000EDD1U) };
    return fill_out_count_pointer_pair(images, pSwapchainImageCount, pSwapchainImages);
}